

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtBvhTriangleMeshShape::performConvexcast
          (cbtBvhTriangleMeshShape *this,cbtTriangleCallback *callback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  MyNodeOverlapCallback myNodeCallback;
  cbtNodeOverlapCallback local_18;
  cbtStridingMeshInterface *local_10;
  cbtTriangleCallback *local_8;
  
  local_10 = (this->super_cbtTriangleMeshShape).m_meshInterface;
  local_18._vptr_cbtNodeOverlapCallback = (_func_int **)&PTR__cbtNodeOverlapCallback_00b496e8;
  local_8 = callback;
  cbtQuantizedBvh::reportBoxCastOverlappingNodex
            (&this->m_bvh->super_cbtQuantizedBvh,&local_18,raySource,rayTarget,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtBvhTriangleMeshShape::performConvexcast(cbtTriangleCallback* callback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax)
{
	struct MyNodeOverlapCallback : public cbtNodeOverlapCallback
	{
		cbtStridingMeshInterface* m_meshInterface;
		cbtTriangleCallback* m_callback;

		MyNodeOverlapCallback(cbtTriangleCallback* callback, cbtStridingMeshInterface* meshInterface)
			: m_meshInterface(meshInterface),
			  m_callback(callback)
		{
		}

		virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			cbtVector3 m_triangle[3];
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(graphicsbase[0] * meshScaling.getX(), graphicsbase[1] * meshScaling.getY(), graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(cbtScalar(graphicsbase[0]) * meshScaling.getX(), cbtScalar(graphicsbase[1]) * meshScaling.getY(), cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}
	};

	MyNodeOverlapCallback myNodeCallback(callback, m_meshInterface);

	m_bvh->reportBoxCastOverlappingNodex(&myNodeCallback, raySource, rayTarget, aabbMin, aabbMax);
}